

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_flt3_arith(DisasContext_conflict6 *ctx,uint32_t opc,int fd,int fr,int fs,int ft)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  TCGv_i64 fp2_11;
  TCGv_i64 fp1_11;
  TCGv_i64 fp0_11;
  TCGv_i64 fp2_10;
  TCGv_i64 fp1_10;
  TCGv_i64 fp0_10;
  TCGv_i32 fp2_9;
  TCGv_i32 fp1_9;
  TCGv_i32 fp0_9;
  TCGv_i64 fp2_8;
  TCGv_i64 fp1_8;
  TCGv_i64 fp0_8;
  TCGv_i64 fp2_7;
  TCGv_i64 fp1_7;
  TCGv_i64 fp0_7;
  TCGv_i32 fp2_6;
  TCGv_i32 fp1_6;
  TCGv_i32 fp0_6;
  TCGv_i64 fp2_5;
  TCGv_i64 fp1_5;
  TCGv_i64 fp0_5;
  TCGv_i64 fp2_4;
  TCGv_i64 fp1_4;
  TCGv_i64 fp0_4;
  TCGv_i32 fp2_3;
  TCGv_i32 fp1_3;
  TCGv_i32 fp0_3;
  TCGv_i64 fp2_2;
  TCGv_i64 fp1_2;
  TCGv_i64 fp0_2;
  TCGv_i64 fp2_1;
  TCGv_i64 fp1_1;
  TCGv_i64 fp0_1;
  TCGv_i32 fp2;
  TCGv_i32 fp1;
  TCGv_i32 fp0;
  TCGLabel *l2;
  TCGLabel *l1;
  TCGv_i32 fph;
  TCGv_i32 fp;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int ft_local;
  int fs_local;
  int fr_local;
  int fd_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  switch(opc) {
  case 0x4c00001e:
    check_ps(ctx);
    pTVar4 = tcg_temp_local_new_i64(tcg_ctx_00);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    l = gen_new_label_mips64el(tcg_ctx_00);
    l_00 = gen_new_label_mips64el(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,pTVar4,fr);
    tcg_gen_andi_i64_mips64el(tcg_ctx_00,pTVar4,pTVar4,7);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,pTVar4,0,l);
    gen_load_fpr32(ctx,pTVar1,fs);
    gen_load_fpr32h(ctx,pTVar2,fs);
    gen_store_fpr32(ctx,pTVar1,fd);
    gen_store_fpr32h(ctx,pTVar2,fd);
    tcg_gen_br(tcg_ctx_00,l_00);
    gen_set_label(tcg_ctx_00,l);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,pTVar4,4,l_00);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    gen_load_fpr32h(ctx,pTVar2,fs);
    gen_load_fpr32(ctx,pTVar1,ft);
    gen_store_fpr32(ctx,pTVar2,fd);
    gen_store_fpr32h(ctx,pTVar1,fd);
    gen_set_label(tcg_ctx_00,l_00);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 0x4c000020:
    check_cop1x(ctx);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    gen_load_fpr32(ctx,pTVar1,fs);
    gen_load_fpr32(ctx,pTVar2,ft);
    gen_load_fpr32(ctx,pTVar3,fr);
    gen_helper_float_madd_s(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env,pTVar1,pTVar2,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    gen_store_fpr32(ctx,pTVar3,fd);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    break;
  case 0x4c000021:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fd | fs | ft | fr);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_fpr64(ctx,pTVar4,fs);
    gen_load_fpr64(ctx,pTVar5,ft);
    gen_load_fpr64(ctx,pTVar6,fr);
    gen_helper_float_madd_d(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    gen_store_fpr64(ctx,pTVar6,fd);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x4c000026:
    check_ps(ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_fpr64(ctx,pTVar4,fs);
    gen_load_fpr64(ctx,pTVar5,ft);
    gen_load_fpr64(ctx,pTVar6,fr);
    gen_helper_float_madd_ps(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    gen_store_fpr64(ctx,pTVar6,fd);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x4c000028:
    check_cop1x(ctx);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    gen_load_fpr32(ctx,pTVar1,fs);
    gen_load_fpr32(ctx,pTVar2,ft);
    gen_load_fpr32(ctx,pTVar3,fr);
    gen_helper_float_msub_s(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env,pTVar1,pTVar2,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    gen_store_fpr32(ctx,pTVar3,fd);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    break;
  case 0x4c000029:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fd | fs | ft | fr);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_fpr64(ctx,pTVar4,fs);
    gen_load_fpr64(ctx,pTVar5,ft);
    gen_load_fpr64(ctx,pTVar6,fr);
    gen_helper_float_msub_d(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    gen_store_fpr64(ctx,pTVar6,fd);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x4c00002e:
    check_ps(ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_fpr64(ctx,pTVar4,fs);
    gen_load_fpr64(ctx,pTVar5,ft);
    gen_load_fpr64(ctx,pTVar6,fr);
    gen_helper_float_msub_ps(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    gen_store_fpr64(ctx,pTVar6,fd);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x4c000030:
    check_cop1x(ctx);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    gen_load_fpr32(ctx,pTVar1,fs);
    gen_load_fpr32(ctx,pTVar2,ft);
    gen_load_fpr32(ctx,pTVar3,fr);
    gen_helper_float_nmadd_s(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env,pTVar1,pTVar2,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    gen_store_fpr32(ctx,pTVar3,fd);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    break;
  case 0x4c000031:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fd | fs | ft | fr);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_fpr64(ctx,pTVar4,fs);
    gen_load_fpr64(ctx,pTVar5,ft);
    gen_load_fpr64(ctx,pTVar6,fr);
    gen_helper_float_nmadd_d(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    gen_store_fpr64(ctx,pTVar6,fd);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x4c000036:
    check_ps(ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_fpr64(ctx,pTVar4,fs);
    gen_load_fpr64(ctx,pTVar5,ft);
    gen_load_fpr64(ctx,pTVar6,fr);
    gen_helper_float_nmadd_ps(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    gen_store_fpr64(ctx,pTVar6,fd);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x4c000038:
    check_cop1x(ctx);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    gen_load_fpr32(ctx,pTVar1,fs);
    gen_load_fpr32(ctx,pTVar2,ft);
    gen_load_fpr32(ctx,pTVar3,fr);
    gen_helper_float_nmsub_s(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env,pTVar1,pTVar2,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    gen_store_fpr32(ctx,pTVar3,fd);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    break;
  case 0x4c000039:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fd | fs | ft | fr);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_fpr64(ctx,pTVar4,fs);
    gen_load_fpr64(ctx,pTVar5,ft);
    gen_load_fpr64(ctx,pTVar6,fr);
    gen_helper_float_nmsub_d(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    gen_store_fpr64(ctx,pTVar6,fd);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x4c00003e:
    check_ps(ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_fpr64(ctx,pTVar4,fs);
    gen_load_fpr64(ctx,pTVar5,ft);
    gen_load_fpr64(ctx,pTVar6,fr);
    gen_helper_float_nmsub_ps(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    gen_store_fpr64(ctx,pTVar6,fd);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
  }
  return;
}

Assistant:

static void gen_flt3_arith(DisasContext *ctx, uint32_t opc,
                           int fd, int fr, int fs, int ft)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    switch (opc) {
    case OPC_ALNV_PS:
        check_ps(ctx);
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv_i32 fp = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fph = tcg_temp_new_i32(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, fr);
            tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x7);

            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, 0, l1);
            gen_load_fpr32(ctx, fp, fs);
            gen_load_fpr32h(ctx, fph, fs);
            gen_store_fpr32(ctx, fp, fd);
            gen_store_fpr32h(ctx, fph, fd);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, 4, l2);
            tcg_temp_free(tcg_ctx, t0);
#ifdef TARGET_WORDS_BIGENDIAN
            gen_load_fpr32(ctx, fp, fs);
            gen_load_fpr32h(ctx, fph, ft);
            gen_store_fpr32h(ctx, fp, fd);
            gen_store_fpr32(ctx, fph, fd);
#else
            gen_load_fpr32h(ctx, fph, fs);
            gen_load_fpr32(ctx, fp, ft);
            gen_store_fpr32(ctx, fph, fd);
            gen_store_fpr32h(ctx, fp, fd);
#endif
            gen_set_label(tcg_ctx, l2);
            tcg_temp_free_i32(tcg_ctx, fp);
            tcg_temp_free_i32(tcg_ctx, fph);
        }
        break;
    case OPC_MADD_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_madd_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_MADD_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_madd_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_MADD_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_madd_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_MSUB_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_msub_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_MSUB_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_msub_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_MSUB_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_msub_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMADD_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_nmadd_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_NMADD_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmadd_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMADD_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmadd_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMSUB_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_nmsub_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_NMSUB_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmsub_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMSUB_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmsub_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    default:
        MIPS_INVAL("flt3_arith");
        generate_exception_end(ctx, EXCP_RI);
        return;
    }
}